

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall
ghc::filesystem::path::lexically_relative(path *__return_storage_ptr__,path *this,path *base)

{
  bool bVar1;
  bool bVar2;
  reference rhs;
  reference ppVar3;
  bool local_611;
  bool local_5fb;
  bool local_5e4;
  bool local_5e1;
  bool local_5d9;
  path *element_1;
  iterator __end2_1;
  iterator __begin2_1;
  input_iterator_range<ghc::filesystem::path::iterator> local_4e0;
  input_iterator_range<ghc::filesystem::path::iterator> *local_450;
  input_iterator_range<ghc::filesystem::path::iterator> *__range2_1;
  int i;
  byte local_419;
  path local_418;
  byte local_3f1;
  path local_3f0;
  path local_3d0;
  reference local_3b0;
  path *element;
  iterator __end2;
  iterator __begin2;
  input_iterator_range<ghc::filesystem::path::iterator> local_2d0;
  input_iterator_range<ghc::filesystem::path::iterator> *local_240;
  input_iterator_range<ghc::filesystem::path::iterator> *__range2;
  undefined4 local_230;
  int count;
  iterator local_228;
  iterator local_1e0;
  byte local_191;
  iterator local_190;
  iterator local_148;
  undefined1 local_100 [8];
  const_iterator b;
  const_iterator a;
  path local_60;
  path local_40;
  path *local_20;
  path *base_local;
  path *this_local;
  path *result;
  
  local_20 = base;
  base_local = this;
  this_local = __return_storage_ptr__;
  root_name(&local_40,this);
  root_name(&local_60,local_20);
  bVar1 = filesystem::operator!=(&local_40,&local_60);
  local_5d9 = true;
  if (!bVar1) {
    bVar1 = is_absolute(this);
    bVar2 = is_absolute(local_20);
    local_5d9 = true;
    if (bVar1 == bVar2) {
      bVar1 = has_root_directory(this);
      local_5e1 = false;
      if (!bVar1) {
        local_5e1 = has_root_directory(local_20);
      }
      local_5d9 = local_5e1;
    }
  }
  ~path(&local_60);
  ~path(&local_40);
  if (local_5d9 == false) {
    begin((iterator *)((long)&b._current._path.field_2 + 8),this);
    begin((iterator *)local_100,local_20);
    while( true ) {
      local_191 = 0;
      end(&local_148,this);
      bVar1 = iterator::operator!=((iterator *)((long)&b._current._path.field_2 + 8),&local_148);
      local_5e4 = false;
      if (bVar1) {
        end(&local_190,local_20);
        local_191 = 1;
        bVar1 = iterator::operator!=((iterator *)local_100,&local_190);
        local_5e4 = false;
        if (bVar1) {
          ppVar3 = iterator::operator*((iterator *)((long)&b._current._path.field_2 + 8));
          rhs = iterator::operator*((iterator *)local_100);
          local_5e4 = filesystem::operator==(ppVar3,rhs);
        }
      }
      if ((local_191 & 1) != 0) {
        iterator::~iterator(&local_190);
      }
      iterator::~iterator(&local_148);
      if (local_5e4 == false) break;
      iterator::operator++((iterator *)((long)&b._current._path.field_2 + 8));
      iterator::operator++((iterator *)local_100);
    }
    count._3_1_ = 0;
    end(&local_1e0,this);
    bVar1 = iterator::operator==((iterator *)((long)&b._current._path.field_2 + 8),&local_1e0);
    local_5fb = false;
    if (bVar1) {
      end(&local_228,local_20);
      count._3_1_ = 1;
      local_5fb = iterator::operator==((iterator *)local_100,&local_228);
    }
    if ((count._3_1_ & 1) != 0) {
      iterator::~iterator(&local_228);
    }
    iterator::~iterator(&local_1e0);
    if (local_5fb == false) {
      __range2._4_4_ = 0;
      end((iterator *)((long)&__begin2._current._path.field_2 + 8),local_20);
      input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                (&local_2d0,(iterator *)local_100,
                 (iterator *)((long)&__begin2._current._path.field_2 + 8));
      iterator::~iterator((iterator *)((long)&__begin2._current._path.field_2 + 8));
      local_240 = &local_2d0;
      input_iterator_range<ghc::filesystem::path::iterator>::begin
                ((iterator *)((long)&__end2._current._path.field_2 + 8),local_240);
      input_iterator_range<ghc::filesystem::path::iterator>::end((iterator *)&element,local_240);
      while (bVar1 = iterator::operator!=
                               ((iterator *)((long)&__end2._current._path.field_2 + 8),
                                (iterator *)&element), bVar1) {
        ppVar3 = iterator::operator*((iterator *)((long)&__end2._current._path.field_2 + 8));
        local_3f1 = 0;
        local_419 = 0;
        local_3b0 = ppVar3;
        path<char[2],ghc::filesystem::path>(&local_3d0,(char (*) [2])0x48ca25,auto_format);
        bVar1 = filesystem::operator!=(ppVar3,&local_3d0);
        ppVar3 = local_3b0;
        local_611 = false;
        if (bVar1) {
          path<char[1],ghc::filesystem::path>(&local_3f0,(char (*) [1])0x4910c7,auto_format);
          local_3f1 = 1;
          bVar1 = filesystem::operator!=(ppVar3,&local_3f0);
          ppVar3 = local_3b0;
          local_611 = false;
          if (bVar1) {
            path<char[3],ghc::filesystem::path>(&local_418,(char (*) [3])0x3aa79c,auto_format);
            local_419 = 1;
            local_611 = filesystem::operator!=(ppVar3,&local_418);
          }
        }
        if ((local_419 & 1) != 0) {
          ~path(&local_418);
        }
        if ((local_3f1 & 1) != 0) {
          ~path(&local_3f0);
        }
        ~path(&local_3d0);
        ppVar3 = local_3b0;
        if (local_611 == false) {
          path<char[3],ghc::filesystem::path>((path *)&i,(char (*) [3])0x3aa79c,auto_format);
          bVar1 = filesystem::operator==(ppVar3,(path *)&i);
          ~path((path *)&i);
          if (bVar1) {
            __range2._4_4_ = __range2._4_4_ + -1;
          }
        }
        else {
          __range2._4_4_ = __range2._4_4_ + 1;
        }
        iterator::operator++((iterator *)((long)&__end2._current._path.field_2 + 8));
      }
      local_230 = 4;
      iterator::~iterator((iterator *)&element);
      iterator::~iterator((iterator *)((long)&__end2._current._path.field_2 + 8));
      input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range(&local_2d0);
      if (__range2._4_4_ < 0) {
        path(__return_storage_ptr__);
      }
      else {
        __range2_1._7_1_ = 0;
        path(__return_storage_ptr__);
        for (__range2_1._0_4_ = 0; (int)__range2_1 < __range2._4_4_;
            __range2_1._0_4_ = (int)__range2_1 + 1) {
          operator/=(__return_storage_ptr__,(char (*) [3])0x3aa79c);
        }
        end((iterator *)((long)&__begin2_1._current._path.field_2 + 8),this);
        input_iterator_range<ghc::filesystem::path::iterator>::input_iterator_range
                  (&local_4e0,(iterator *)((long)&b._current._path.field_2 + 8),
                   (iterator *)((long)&__begin2_1._current._path.field_2 + 8));
        iterator::~iterator((iterator *)((long)&__begin2_1._current._path.field_2 + 8));
        local_450 = &local_4e0;
        input_iterator_range<ghc::filesystem::path::iterator>::begin
                  ((iterator *)((long)&__end2_1._current._path.field_2 + 8),local_450);
        input_iterator_range<ghc::filesystem::path::iterator>::end((iterator *)&element_1,local_450)
        ;
        while (bVar1 = iterator::operator!=
                                 ((iterator *)((long)&__end2_1._current._path.field_2 + 8),
                                  (iterator *)&element_1), bVar1) {
          ppVar3 = iterator::operator*((iterator *)((long)&__end2_1._current._path.field_2 + 8));
          operator/=(__return_storage_ptr__,ppVar3);
          iterator::operator++((iterator *)((long)&__end2_1._current._path.field_2 + 8));
        }
        local_230 = 9;
        iterator::~iterator((iterator *)&element_1);
        iterator::~iterator((iterator *)((long)&__end2_1._current._path.field_2 + 8));
        input_iterator_range<ghc::filesystem::path::iterator>::~input_iterator_range(&local_4e0);
        __range2_1._7_1_ = 1;
      }
    }
    else {
      path<char[2],ghc::filesystem::path>(__return_storage_ptr__,(char (*) [2])0x48ca25,auto_format)
      ;
    }
    local_230 = 1;
    iterator::~iterator((iterator *)local_100);
    iterator::~iterator((iterator *)((long)&b._current._path.field_2 + 8));
  }
  else {
    path(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

GHC_INLINE path path::lexically_relative(const path& base) const
{
    if (root_name() != base.root_name() || is_absolute() != base.is_absolute() || (!has_root_directory() && base.has_root_directory())) {
        return path();
    }
    const_iterator a = begin(), b = base.begin();
    while (a != end() && b != base.end() && *a == *b) {
        ++a;
        ++b;
    }
    if (a == end() && b == base.end()) {
        return path(".");
    }
    int count = 0;
    for (const auto& element : input_iterator_range<const_iterator>(b, base.end())) {
        if (element != "." && element != "" && element != "..") {
            ++count;
        }
        else if (element == "..") {
            --count;
        }
    }
    if (count < 0) {
        return path();
    }
    path result;
    for (int i = 0; i < count; ++i) {
        result /= "..";
    }
    for (const auto& element : input_iterator_range<const_iterator>(a, end())) {
        result /= element;
    }
    return result;
}